

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O2

RGBColor __thiscall pm::Matte::areaLightShade(Matte *this,ShadeRecord *sr)

{
  World *pWVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  long in_RDX;
  uint uVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float extraout_XMM0_Da_00;
  float fVar12;
  float extraout_XMM0_Db;
  undefined4 uVar13;
  float extraout_XMM0_Db_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  RGBColor RVar19;
  Vector3 wi;
  RGBColor local_80;
  undefined8 local_74;
  float local_6c;
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 uVar11;
  
  fVar12 = (sr->ray).o.y;
  uVar11 = *(undefined8 *)&(sr->normal).z;
  fVar15 = (float)uVar11;
  fVar9 = (float)((ulong)uVar11 >> 0x20);
  local_68._4_4_ = fVar9;
  local_68._0_4_ = fVar15 * (sr->ray).o.z;
  local_68._8_8_ = 0;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_80);
  fVar9 = local_80.r * fVar15 * fVar9;
  fVar12 = local_80.g * fVar12 * fVar15;
  auVar14._4_12_ = local_68._4_12_;
  auVar14._0_4_ = local_68._0_4_ * local_80.b;
  (this->super_Material)._vptr_Material = (_func_int **)CONCAT44(fVar12,fVar9);
  (this->super_Material).type_ = (Type)auVar14._0_4_;
  lVar2 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80);
  lVar3 = *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  uVar8 = 0;
  do {
    if ((ulong)(lVar2 - lVar3 >> 3) <= (ulong)uVar8) {
      RVar19.g = fVar12;
      RVar19.r = fVar9;
      RVar19.b = auVar14._0_4_;
      return RVar19;
    }
    plVar4 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + (ulong)uVar8 * 8);
    (**(code **)(*plVar4 + 0x10))(&local_40,plVar4);
    fVar9 = (float)local_40;
    fVar12 = (float)((ulong)local_40 >> 0x20);
    auVar14 = ZEXT416((uint)local_38);
    fVar15 = *(float *)(in_RDX + 0x30) * local_38 +
             *(float *)(in_RDX + 0x28) * fVar9 + fVar12 * *(float *)(in_RDX + 0x2c);
    if (0.0 < fVar15) {
      local_68._0_16_ = ZEXT416((uint)fVar15);
      if (*(char *)((long)plVar4 + 0xc) == '\x01') {
        local_80._0_8_ = *(undefined8 *)(in_RDX + 0x10);
        local_80.b = *(float *)(in_RDX + 0x18);
        local_74 = local_40;
        local_6c = local_38;
        cVar7 = (**(code **)(*plVar4 + 0x20))(plVar4,&local_80);
        auVar14._8_8_ = extraout_XMM1_Qb;
        auVar14._0_8_ = extraout_XMM1_Qa;
        fVar9 = extraout_XMM0_Da;
        fVar12 = extraout_XMM0_Db;
        if (cVar7 != '\0') goto LAB_001109b1;
      }
      fVar12 = *(float *)&sr->tracer;
      pWVar1 = sr->world;
      fVar17 = SUB84(pWVar1,0);
      fVar9 = *(float *)((long)&sr->tracer + 4);
      (**(code **)(*plVar4 + 0x18))(local_50,plVar4);
      fVar15 = local_50._0_4_;
      fVar16 = local_50._4_4_;
      fVar9 = fVar17 * fVar9 * 0.31830987 * local_48;
      uVar11 = (**(code **)(*plVar4 + 0x28))(plVar4);
      fVar18 = (float)((ulong)uVar11 >> 0x20);
      fVar10 = (float)uVar11;
      fVar15 = (float)local_68._0_4_ *
               fVar10 * fVar15 * fVar17 * (float)((ulong)pWVar1 >> 0x20) * 0.31830987;
      fVar16 = (float)local_68._0_4_ * fVar10 * fVar16 * fVar12 * fVar17 * 0.31830987;
      fVar17 = (float)local_68._4_4_ * fVar18 * 0.0;
      fVar18 = (float)local_68._4_4_ * fVar18 * 0.0;
      fVar9 = fVar9 * fVar10 * (float)local_68._0_4_;
      uVar11 = (**(code **)(*plVar4 + 0x30))(plVar4);
      uVar13 = (undefined4)((ulong)uVar11 >> 0x20);
      fVar12 = (float)uVar11;
      local_80.b = fVar9 / fVar12;
      auVar6._4_4_ = fVar16;
      auVar6._0_4_ = fVar15;
      auVar6._8_4_ = fVar17;
      auVar6._12_4_ = fVar18;
      auVar5._4_4_ = fVar12;
      auVar5._0_4_ = fVar12;
      auVar5._8_4_ = uVar13;
      auVar5._12_4_ = uVar13;
      auVar14 = divps(auVar6,auVar5);
      local_80._0_8_ = auVar14._0_8_;
      RGBColor::operator+=((RGBColor *)this,&local_80);
      fVar9 = extraout_XMM0_Da_00;
      fVar12 = extraout_XMM0_Db_00;
    }
LAB_001109b1:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

RGBColor Matte::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}